

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O1

shared_ptr<duckdb::BlockHandle,_true> __thiscall
duckdb::UncompressedStringSegmentState::GetHandle
          (UncompressedStringSegmentState *this,BlockManager *manager_p,block_id_t block_id)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  size_type *this_00;
  ulong uVar2;
  long *plVar3;
  _Head_base<0UL,_duckdb::StringBlock_*,_false> _Var4;
  int iVar5;
  long lVar6;
  ulong in_RCX;
  ulong uVar7;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long *plVar8;
  long *plVar9;
  shared_ptr<duckdb::BlockHandle,_true> sVar10;
  undefined1 local_40 [8];
  _func_int **local_38;
  StringBlock *local_30;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&manager_p->metadata_manager);
  if (iVar5 != 0) {
    ::std::__throw_system_error(iVar5);
  }
  uVar2 = *(ulong *)((long)&manager_p[1].blocks_lock.super___mutex_base._M_mutex + 8);
  uVar7 = in_RCX % uVar2;
  plVar8 = *(long **)(manager_p[1].blocks_lock.super___mutex_base._M_mutex.__align + uVar7 * 8);
  plVar9 = (long *)0x0;
  if ((plVar8 != (long *)0x0) &&
     (plVar3 = (long *)*plVar8, plVar9 = plVar8, ((long *)*plVar8)[1] != in_RCX)) {
    while (plVar8 = plVar3, plVar3 = (long *)*plVar8, plVar3 != (long *)0x0) {
      plVar9 = (long *)0x0;
      if (((ulong)plVar3[1] % uVar2 != uVar7) || (plVar9 = plVar8, plVar3[1] == in_RCX))
      goto LAB_0175c7c9;
    }
    plVar9 = (long *)0x0;
  }
LAB_0175c7c9:
  if (plVar9 == (long *)0x0) {
    lVar6 = 0;
  }
  else {
    lVar6 = *plVar9;
  }
  if (lVar6 == 0) {
    if ((manager_p->blocks)._M_h._M_element_count != 0) {
      this_00 = &(manager_p->blocks)._M_h._M_element_count;
      optional_ptr<duckdb::BlockManager,_true>::CheckValid
                ((optional_ptr<duckdb::BlockManager,_true> *)this_00);
      block_id = *this_00;
    }
    sVar10 = BlockManager::RegisterBlock((BlockManager *)this,block_id);
    local_38 = (this->super_CompressedSegmentState)._vptr_CompressedSegmentState;
    local_30 = (this->head).
               super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t
               .
               super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>
               ._M_t.
               super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>
               .super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl;
    if (local_30 != (StringBlock *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_30->block + 8);
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)&local_30->block + 8);
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
    ::std::
    _Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
    ::_M_emplace<std::pair<long,duckdb::shared_ptr<duckdb::BlockHandle,true>>>
              ((_Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                *)&manager_p[1].blocks_lock,local_40,
               sVar10.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
    if (local_30 != (StringBlock *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_30);
    }
  }
  else {
    (this->super_CompressedSegmentState)._vptr_CompressedSegmentState =
         *(_func_int ***)(lVar6 + 0x10);
    _Var4._M_head_impl = *(StringBlock **)(lVar6 + 0x18);
    (this->head).super_unique_ptr<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>.
    _M_t.super___uniq_ptr_impl<duckdb::StringBlock,_std::default_delete<duckdb::StringBlock>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::StringBlock_*,_std::default_delete<duckdb::StringBlock>_>.
    super__Head_base<0UL,_duckdb::StringBlock_*,_false>._M_head_impl = _Var4._M_head_impl;
    if (_Var4._M_head_impl != (StringBlock *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((_Var4._M_head_impl)->block).internal + 8);
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
        UNLOCK();
      }
      else {
        p_Var1 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 ((long)&((_Var4._M_head_impl)->block).internal + 8);
        *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
      }
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&manager_p->metadata_manager);
  sVar10.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar10.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<duckdb::BlockHandle,_true>)
         sVar10.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<BlockHandle> UncompressedStringSegmentState::GetHandle(BlockManager &manager_p, block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	auto entry = handles.find(block_id);
	if (entry != handles.end()) {
		return entry->second;
	}
	auto &manager = block_manager ? *block_manager : manager_p;
	auto result = manager.RegisterBlock(block_id);
	handles.insert(make_pair(block_id, result));
	return result;
}